

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O2

int Curl_str_quotedword(char **linep,Curl_str *out,size_t max)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = *linep;
  out->str = (char *)0x0;
  out->len = 0;
  if (*pcVar1 != '\"') {
    return 3;
  }
  pcVar1 = pcVar1 + 2;
  sVar2 = 0;
  while( true ) {
    if (pcVar1[-1] == '\0') {
      return 4;
    }
    if (pcVar1[-1] == '\"') break;
    sVar2 = sVar2 + 1;
    pcVar1 = pcVar1 + 1;
    if (max < sVar2) {
      return 1;
    }
  }
  out->str = *linep + 1;
  out->len = sVar2;
  *linep = pcVar1;
  return 0;
}

Assistant:

int Curl_str_quotedword(const char **linep, struct Curl_str *out,
                        const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  if(*s != '\"')
    return STRE_BEGQUOTE;
  s++;
  while(*s && (*s != '\"')) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(*s != '\"')
    return STRE_ENDQUOTE;
  out->str = (*linep) + 1;
  out->len = len;
  *linep = s + 1;
  return STRE_OK;
}